

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void find_suite::adjacent_find_if(void)

{
  basic_iterator<int> first_end;
  ulong uVar1;
  ulong uVar2;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_end_00;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_99;
  vector<int,_std::allocator<int>_> local_98;
  circular_view<int,_18446744073709551615UL> local_78;
  view_pointer local_58;
  size_type sStack_50;
  basic_iterator<int> local_48;
  int local_34 [3];
  type local_28 [4];
  
  local_78.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_78.member.cap = 4;
  local_78.member.size = 0;
  local_78.member.next = 4;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x210000002c;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x1600000021;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0xb;
  input._M_len = 5;
  input._M_array = (iterator)&local_98;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_78,input);
  uVar1 = local_78.member.cap * 2;
  if ((uVar1 & local_78.member.cap * 2 - 1) == 0) {
    uVar2 = local_78.member.next - local_78.member.size & uVar1 - 1;
    uVar1 = uVar1 - 1 & local_78.member.next;
  }
  else {
    uVar2 = (local_78.member.next - local_78.member.size) % uVar1;
    uVar1 = local_78.member.next % uVar1;
  }
  first_end_00 = std::
                 __adjacent_find<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                           (&local_78,uVar2,&local_78,uVar1);
  local_34[0] = 0x21;
  __l._M_len = 1;
  __l._M_array = local_34;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l,&local_99);
  uVar1 = local_78.member.cap * 2;
  if ((uVar1 & local_78.member.cap * 2 - 1) == 0) {
    uVar1 = uVar1 - 1 & local_78.member.next - local_78.member.size;
  }
  else {
    uVar1 = (local_78.member.next - local_78.member.size) % uVar1;
  }
  first_begin.current = uVar1;
  first_begin.parent = &local_78;
  local_48 = first_end_00;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x15d,"void find_suite::adjacent_find_if()",first_begin,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_34[0] = 0x21;
  local_34[1] = 0x16;
  local_34[2] = 0xb;
  __l_00._M_len = 3;
  __l_00._M_array = local_34;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_00,&local_99);
  uVar1 = local_78.member.cap * 2;
  if ((uVar1 & local_78.member.cap * 2 - 1) == 0) {
    sStack_50 = uVar1 - 1 & local_78.member.next;
  }
  else {
    sStack_50 = local_78.member.next % uVar1;
  }
  first_end.current = sStack_50;
  first_end.parent = &local_78;
  local_58 = &local_78;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x162,"void find_suite::adjacent_find_if()",first_end_00,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void adjacent_find_if()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 44, 33, 33, 22, 11 };
    auto where = std::adjacent_find(span.begin(), span.end(), std::greater<int>());
    {
        std::vector<int> expect = { 33 };
        BOOST_TEST_ALL_EQ(span.begin(), where,
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> expect = { 33, 22, 11 };
        BOOST_TEST_ALL_EQ(where, span.end(),
                          expect.begin(), expect.end());
    }
}